

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

bool __thiscall PSound::ReadValue(PSound *this,FArchive *ar,void *addr)

{
  int iVar1;
  char *logicalname;
  BYTE tag;
  FString str;
  byte local_21;
  FString local_20;
  
  FArchive::operator<<(ar,&local_21);
  if (local_21 == 0xc) {
    local_20.Chars = FString::NullString.Nothing;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    FArchive::operator<<(ar,&local_20);
    iVar1 = S_FindSound(local_20.Chars);
    *(int *)addr = iVar1;
    FString::~FString(&local_20);
  }
  else {
    if (local_21 != 0xd) {
      PType::SkipValue(ar,(uint)local_21);
      return false;
    }
    logicalname = FArchive::ReadName(ar);
    iVar1 = S_FindSound(logicalname);
    *(int *)addr = iVar1;
  }
  return true;
}

Assistant:

bool PSound::ReadValue(FArchive &ar, void *addr) const
{
	BYTE tag;

	ar << tag;
	if (tag == VAL_Name)
	{
		const char *str = ar.ReadName();
		*(FSoundID *)addr = FSoundID(str);
	}
	else if (tag == VAL_String)
	{
		FString str;
		ar << str;
		*(FSoundID *)addr = FSoundID(str);
	}
	else
	{
		SkipValue(ar, tag);
		return false;
	}
	return true;
}